

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::osout<char,std::__cxx11::string,char[15]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ptc *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [15])

{
  basic_streambuf<char,_std::char_traits<char>_> *sbuf_00;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  savebuf<char> sbuf;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_streambuf<char,_std::char_traits<char>_> *buf;
  Print<char> printer;
  char (*args_local_1) [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  printer._96_8_ = args;
  Print<char>::Print((Print<char> *)&buf);
  sbuf_00 = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(sbuf.save.field_2._M_local_buf + 8));
  savebuf<char>::savebuf((savebuf<char> *)local_280,sbuf_00);
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  poVar1 = std::operator<<((ostream *)((long)&sbuf.save.field_2 + 8),(string *)this);
  pbVar2 = Print<char>::getSep_abi_cxx11_((Print<char> *)&buf);
  std::operator<<(poVar1,(string *)pbVar2);
  poVar1 = std::operator<<((ostream *)((long)&sbuf.save.field_2 + 8),(char *)printer._96_8_);
  pbVar2 = Print<char>::getSep_abi_cxx11_((Print<char> *)&buf);
  std::operator<<(poVar1,(string *)pbVar2);
  std::__cxx11::ostringstream::str();
  Print<char>::operator()
            ((Print<char> *)&buf,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
             &local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  savebuf<char>::str_abi_cxx11_(__return_storage_ptr__,(savebuf<char> *)local_280);
  savebuf<char>::~savebuf((savebuf<char> *)local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(sbuf.save.field_2._M_local_buf + 8))
  ;
  Print<char>::~Print((Print<char> *)&buf);
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = select_cout<T>::cout.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    select_cout<T>::cout.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( select_cout<T>::cout, str.str() );
    select_cout<T>::cout.rdbuf( buf );
    return sbuf.str();
   }